

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Intrinsics.cpp
# Opt level: O1

Value * soul::performIntrinsic
                  (Value *__return_storage_ptr__,IntrinsicType i,ArrayView<soul::Value> args)

{
  Category CVar1;
  Primitive PVar2;
  StructurePtr o;
  bool bVar3;
  Value *pVVar4;
  Value *this;
  undefined1 in_R9B;
  Value *source;
  Value *__end1;
  Value *__begin1;
  ArrayView<soul::Value> args_00;
  Type argType;
  Type t;
  Value result;
  ArrayWithPreallocation<soul::Value,_4UL> castArgs;
  Type local_1c0;
  IntrinsicType local_1a4;
  Type local_1a0;
  Value local_188;
  undefined1 local_148 [280];
  
  pVVar4 = args.e;
  this = args.s;
  local_1a4 = i;
  if (this == pVVar4) {
    throwInternalCompilerError("! empty()","front",0xbf);
  }
  local_1c0.category = (this->type).category;
  local_1c0.arrayElementCategory = (this->type).arrayElementCategory;
  local_1c0.isRef = (this->type).isRef;
  local_1c0.isConstant = (this->type).isConstant;
  local_1c0.primitiveType.type = (this->type).primitiveType.type;
  local_1c0.boundingSize = (this->type).boundingSize;
  local_1c0.arrayElementBoundingSize = (this->type).arrayElementBoundingSize;
  local_1c0.structure.object = (this->type).structure.object;
  if (local_1c0.structure.object != (Structure *)0x0) {
    ((local_1c0.structure.object)->super_RefCountedObject).refCount =
         ((local_1c0.structure.object)->super_RefCountedObject).refCount + 1;
  }
  if (this != pVVar4) {
    source = this;
    do {
      PVar2 = (source->type).primitiveType.type;
      CVar1 = (source->type).category;
      if ((1 < PVar2 - int32 || CVar1 != primitive) &&
         (((PVar2 & ~void_) != float32 || (CVar1 != primitive)))) {
        (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
        (__return_storage_ptr__->allocatedData).allocatedSize = 0;
        (__return_storage_ptr__->type).category = invalid;
        (__return_storage_ptr__->type).arrayElementCategory = invalid;
        (__return_storage_ptr__->type).isRef = false;
        (__return_storage_ptr__->type).isConstant = false;
        (__return_storage_ptr__->type).primitiveType = invalid;
        (__return_storage_ptr__->type).boundingSize = 0;
        (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.items =
             (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
        (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
        (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
        goto LAB_001ae6dc;
      }
      bVar3 = TypeRules::canPassAsArgumentTo(&local_1c0,&source->type,false);
      o.object = local_1c0.structure.object;
      if (!bVar3) {
        local_1c0.category = (source->type).category;
        local_1c0.arrayElementCategory = (source->type).arrayElementCategory;
        local_1c0.isRef = (source->type).isRef;
        local_1c0.isConstant = (source->type).isConstant;
        local_1c0.primitiveType.type = (source->type).primitiveType.type;
        local_1c0.boundingSize = (source->type).boundingSize;
        local_1c0.arrayElementBoundingSize = (source->type).arrayElementBoundingSize;
        local_1c0.structure.object = (source->type).structure.object;
        if (local_1c0.structure.object != (Structure *)0x0) {
          ((local_1c0.structure.object)->super_RefCountedObject).refCount =
               ((local_1c0.structure.object)->super_RefCountedObject).refCount + 1;
        }
        RefCountedPtr<soul::Structure>::decIfNotNull(o.object);
      }
      source = source + 1;
    } while (source != pVVar4);
  }
  local_148._0_8_ = local_148 + 0x18;
  local_148._8_8_ = 0;
  local_148._16_8_ = 4;
  if (this != pVVar4) {
    do {
      Value::castToTypeExpectingSuccess(&local_188,this,&local_1c0);
      ArrayWithPreallocation<soul::Value,_4UL>::push_back
                ((ArrayWithPreallocation<soul::Value,_4UL> *)local_148,&local_188);
      Value::~Value(&local_188);
      this = this + 1;
    } while (this != pVVar4);
  }
  args_00.s = (Value *)(local_148._0_8_ + local_148._8_8_ * 0x40);
  args_00.e._0_1_ = (local_1c0.primitiveType.type & ~void_) == float32;
  args_00.e._1_7_ = 0;
  CompileTimeIntrinsicEvaluation::perform
            (&local_188,(CompileTimeIntrinsicEvaluation *)(ulong)local_1a4,
             (IntrinsicType)local_148._0_8_,args_00,(bool)in_R9B);
  if (local_188.type.category == invalid) {
    (__return_storage_ptr__->type).structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = 0;
    (__return_storage_ptr__->type).category = invalid;
    (__return_storage_ptr__->type).arrayElementCategory = invalid;
    (__return_storage_ptr__->type).isRef = false;
    (__return_storage_ptr__->type).isConstant = false;
    (__return_storage_ptr__->type).primitiveType = invalid;
    (__return_storage_ptr__->type).boundingSize = 0;
    (__return_storage_ptr__->type).arrayElementBoundingSize = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.items =
         (uchar *)(__return_storage_ptr__->allocatedData).allocatedData.space;
    (__return_storage_ptr__->allocatedData).allocatedData.numActive = 0;
    (__return_storage_ptr__->allocatedData).allocatedData.numAllocated = 8;
  }
  else if (local_188.type.primitiveType.type == bool_) {
    (__return_storage_ptr__->type).category = local_188.type.category;
    (__return_storage_ptr__->type).arrayElementCategory = local_188.type.arrayElementCategory;
    (__return_storage_ptr__->type).isRef = local_188.type.isRef;
    (__return_storage_ptr__->type).isConstant = local_188.type.isConstant;
    (__return_storage_ptr__->type).primitiveType.type = bool_;
    (__return_storage_ptr__->type).boundingSize = local_188.type.boundingSize;
    (__return_storage_ptr__->type).arrayElementBoundingSize =
         local_188.type.arrayElementBoundingSize;
    (__return_storage_ptr__->type).structure.object = local_188.type.structure.object;
    local_188.type.structure.object = (Structure *)0x0;
    (__return_storage_ptr__->allocatedData).allocatedSize = local_188.allocatedData.allocatedSize;
    ArrayWithPreallocation<unsigned_char,_8UL>::ArrayWithPreallocation
              (&(__return_storage_ptr__->allocatedData).allocatedData,
               &local_188.allocatedData.allocatedData);
  }
  else {
    local_1a0.boundingSize = local_1c0.boundingSize;
    local_1a0.arrayElementBoundingSize = local_1c0.arrayElementBoundingSize;
    local_1a0.structure.object = local_1c0.structure.object;
    if (local_1c0.structure.object != (Structure *)0x0) {
      ((local_1c0.structure.object)->super_RefCountedObject).refCount =
           ((local_1c0.structure.object)->super_RefCountedObject).refCount + 1;
    }
    local_1a0._0_8_ = CONCAT44(local_1c0.primitiveType.type,local_1c0._0_4_) & 0xffffffff0000ffff;
    Value::castToTypeExpectingSuccess(__return_storage_ptr__,&local_188,&local_1a0);
    RefCountedPtr<soul::Structure>::decIfNotNull(local_1a0.structure.object);
  }
  Value::~Value(&local_188);
  ArrayWithPreallocation<soul::Value,_4UL>::clear
            ((ArrayWithPreallocation<soul::Value,_4UL> *)local_148);
LAB_001ae6dc:
  RefCountedPtr<soul::Structure>::decIfNotNull(local_1c0.structure.object);
  return __return_storage_ptr__;
}

Assistant:

Value performIntrinsic (IntrinsicType i, ArrayView<Value> args)
{
    auto argType = args.front().getType();

    for (auto& a : args)
    {
        const auto& t = a.getType();

        if (! (t.isPrimitiveInteger() || t.isPrimitiveFloat()))
            return {};

        if (! TypeRules::canPassAsArgumentTo (argType, t, false))
            argType = t;
    }

    ArrayWithPreallocation<Value, 4> castArgs;

    for (auto& a : args)
        castArgs.push_back (a.castToTypeExpectingSuccess (argType));

    auto result = CompileTimeIntrinsicEvaluation::perform (i, castArgs, argType.isFloatingPoint());

    if (! result.isValid())
        return {};

    if (result.getType().isBool())
        return result;

    return result.castToTypeExpectingSuccess (argType.withConstAndRefFlags (false, false));
}